

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_byteout(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  if (mqc->bp < mqc->start + -1) {
    __assert_fail("mqc->bp >= mqc->start - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                  ,0xbd,"void opj_mqc_byteout(opj_mqc_t *)");
  }
  if (*mqc->bp == 0xff) {
    mqc->bp = mqc->bp + 1;
    *mqc->bp = (OPJ_BYTE)(mqc->c >> 0x14);
    mqc->c = mqc->c & 0xfffff;
    mqc->ct = 7;
  }
  else if ((mqc->c & 0x8000000) == 0) {
    mqc->bp = mqc->bp + 1;
    *mqc->bp = (OPJ_BYTE)(mqc->c >> 0x13);
    mqc->c = mqc->c & 0x7ffff;
    mqc->ct = 8;
  }
  else {
    *mqc->bp = *mqc->bp + '\x01';
    if (*mqc->bp == 0xff) {
      mqc->c = mqc->c & 0x7ffffff;
      mqc->bp = mqc->bp + 1;
      *mqc->bp = (OPJ_BYTE)(mqc->c >> 0x14);
      mqc->c = mqc->c & 0xfffff;
      mqc->ct = 7;
    }
    else {
      mqc->bp = mqc->bp + 1;
      *mqc->bp = (OPJ_BYTE)(mqc->c >> 0x13);
      mqc->c = mqc->c & 0x7ffff;
      mqc->ct = 8;
    }
  }
  return;
}

Assistant:

static void opj_mqc_byteout(opj_mqc_t *mqc)
{
    /* bp is initialized to start - 1 in opj_mqc_init_enc() */
    /* but this is safe, see opj_tcd_code_block_enc_allocate_data() */
    assert(mqc->bp >= mqc->start - 1);
    if (*mqc->bp == 0xff) {
        mqc->bp++;
        *mqc->bp = (OPJ_BYTE)(mqc->c >> 20);
        mqc->c &= 0xfffff;
        mqc->ct = 7;
    } else {
        if ((mqc->c & 0x8000000) == 0) {
            mqc->bp++;
            *mqc->bp = (OPJ_BYTE)(mqc->c >> 19);
            mqc->c &= 0x7ffff;
            mqc->ct = 8;
        } else {
            (*mqc->bp)++;
            if (*mqc->bp == 0xff) {
                mqc->c &= 0x7ffffff;
                mqc->bp++;
                *mqc->bp = (OPJ_BYTE)(mqc->c >> 20);
                mqc->c &= 0xfffff;
                mqc->ct = 7;
            } else {
                mqc->bp++;
                *mqc->bp = (OPJ_BYTE)(mqc->c >> 19);
                mqc->c &= 0x7ffff;
                mqc->ct = 8;
            }
        }
    }
}